

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O0

void __thiscall mocker::ast::NullLitExpr::~NullLitExpr(NullLitExpr *this)

{
  NullLitExpr *this_local;
  
  ~NullLitExpr(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

NullLitExpr() = default;